

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O2

GLenum __thiscall irr::video::COpenGLDriver::getZBufferBits(COpenGLDriver *this)

{
  u8 uVar1;
  
  uVar1 = (this->Params).ZBufferBits;
  if (uVar1 == '\x10') {
    return 0x81a5;
  }
  if (uVar1 != ' ') {
    if (uVar1 == '\x18') {
      return 0x81a6;
    }
    return 0x1902;
  }
  return 0x81a7;
}

Assistant:

GLenum COpenGLDriver::getZBufferBits() const
{
	GLenum bits = 0;
	switch (Params.ZBufferBits) {
	case 16:
		bits = GL_DEPTH_COMPONENT16;
		break;
	case 24:
		bits = GL_DEPTH_COMPONENT24;
		break;
	case 32:
		bits = GL_DEPTH_COMPONENT32;
		break;
	default:
		bits = GL_DEPTH_COMPONENT;
		break;
	}
	return bits;
}